

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O1

SQInteger SqModules::sqRequire<false>(HSQUIRRELVM vm)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  HSQOBJECT obj;
  SQChar *__s;
  SqModules *this;
  bool bVar2;
  int iVar3;
  SQRESULT SVar4;
  iterator iVar5;
  _Hash_node_base *p_Var6;
  long n;
  string errMsg;
  Object exports;
  char *fileName;
  SQInteger fileNameLen;
  SQUserPointer selfPtr;
  key_type local_70;
  Object local_50;
  SQChar *local_38;
  SQInteger local_30;
  SqModules *local_28;
  
  local_28 = (SqModules *)0x0;
  SVar4 = sq_getuserpointer(vm,-1,&local_28);
  this = local_28;
  if (SVar4 < 0 || local_28 == (SqModules *)0x0) {
    SVar4 = sq_throwerror(vm,"No module manager");
  }
  else {
    local_38 = (char *)0x0;
    local_30 = -1;
    sq_getstringandsize(vm,2,&local_38,&local_30);
    __s = local_38;
    iVar3 = strcmp(local_38,"quirrel.native_modules");
    if (iVar3 == 0) {
      sq_newarray(vm,(this->nativeModules)._M_h._M_element_count);
      p_Var6 = (this->nativeModules)._M_h._M_before_begin._M_nxt;
      SVar4 = 1;
      if (p_Var6 != (_Hash_node_base *)0x0) {
        n = 0;
        do {
          sq_pushinteger(vm,n);
          sq_pushstring(vm,(SQChar *)p_Var6[1]._M_nxt,-1);
          sq_set(vm,-3);
          n = n + 1;
          p_Var6 = p_Var6->_M_nxt;
        } while (p_Var6 != (_Hash_node_base *)0x0);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,__s,(allocator<char> *)&local_50);
      iVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->nativeModules)._M_h,&local_70);
      paVar1 = &local_70.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_50.vm = (HSQUIRRELVM)0x0;
        local_50.obj._type = OT_NULL;
        local_50.obj._4_4_ = local_50.obj._4_4_ & 0xffffff00;
        local_50.obj._unVal.pTable = (SQTable *)0x0;
        sq_resetobject(&local_50.obj);
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_70._M_dataplus._M_p = (pointer)paVar1;
        bVar2 = requireModule(this,local_38,false,__fn__,&local_50,&local_70);
        if (bVar2) {
          SVar4 = 1;
          obj._flags = local_50.obj._flags;
          obj._5_3_ = local_50.obj._5_3_;
          obj._type = local_50.obj._type;
          obj._unVal.pTable = local_50.obj._unVal.pTable;
          sq_pushobject(vm,obj);
        }
        else {
          SVar4 = sq_throwerror(vm,local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
        Sqrat::Object::~Object(&local_50);
      }
      else {
        sq_pushobject(vm,*(HSQOBJECT *)
                          ((long)iVar5.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_true>
                                 ._M_cur + 0x30));
        SVar4 = 1;
      }
    }
  }
  return SVar4;
}

Assistant:

SQInteger SqModules::sqRequire(HSQUIRRELVM vm)
{
  SQUserPointer selfPtr = nullptr;
  if (SQ_FAILED(sq_getuserpointer(vm, -1, &selfPtr)) || !selfPtr)
    return sq_throwerror(vm, "No module manager");

  SqModules *self = reinterpret_cast<SqModules *>(selfPtr);
  SQRAT_ASSERT(self->sqvm == vm);

  const char *fileName = nullptr;
  SQInteger fileNameLen = -1;
  sq_getstringandsize(vm, 2, &fileName, &fileNameLen);

  if (strcmp(fileName, "quirrel.native_modules")==0)
  {
    sq_newarray(vm, self->nativeModules.size());
    SQInteger idx = 0;
    for (auto &nm : self->nativeModules)
    {
      sq_pushinteger(vm, idx);
      sq_pushstring(vm, nm.first.data(), -1);
      sq_set(vm, -3);
      ++idx;
    }
    return 1;
  }

  auto nativeIt = self->nativeModules.find(fileName);
  if (nativeIt != self->nativeModules.end())
  {
    sq_pushobject(vm, nativeIt->second.GetObject());
    return 1;
  }

  Sqrat::Object exports;
  string errMsg;
  if (!self->requireModule(fileName, must_exist, __fn__, exports, errMsg))
    return sq_throwerror(vm, errMsg.c_str());

  sq_pushobject(vm, exports.GetObject());
  return 1;
}